

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
          (iuCartesianProductHolder *this)

{
  iuIParamGenerator<std::tuple<bool,_int,_int>_> *piVar1;
  iuIParamGenerator<int> *piVar2;
  
  piVar1 = (iuIParamGenerator<std::tuple<bool,_int,_int>_> *)operator_new(0x38);
  piVar1->_vptr_iuIParamGenerator = (_func_int **)&PTR__iuCartesianProductGenerator_003aac00;
  piVar1[1]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_003aaa80;
  piVar1[2]._vptr_iuIParamGenerator = (_func_int **)0x0;
  piVar1[3]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_003aaa80;
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)0x0;
  piVar1[5]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_003aaae8;
  piVar1[6]._vptr_iuIParamGenerator = (_func_int **)0x0;
  piVar1[6]._vptr_iuIParamGenerator = *(_func_int ***)(this + 0x20);
  piVar2 = iuValueArray::operator_cast_to_iuIParamGenerator_((iuValueArray *)(this + 0x10));
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)piVar2;
  piVar1[2]._vptr_iuIParamGenerator = *(_func_int ***)(this + 8);
  return piVar1;
}

Assistant:

operator iuIParamGenerator< tuples::tuple<Args...> >* () const
    {
        iuCartesianProductGenerator<Args...>* p = new iuCartesianProductGenerator<Args...>();
        tuples::tuple_cast_copy(p->generators(), v);
        return p;
    }